

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

int main(void)

{
  undefined1 in_stack_000004f7;
  
  verify_stale_block_reuse_test();
  verify_staleblock_reuse_param_test();
  reuse_with_snapshot_test();
  verify_minimum_num_keeping_headers_param_test();
  verify_high_num_keeping_headers_param_test();
  snapshot_before_block_reuse_test((bool)in_stack_000004f7);
  snapshot_before_block_reuse_test((bool)in_stack_000004f7);
  snapshot_after_block_reuse_test();
  variable_value_size_test();
  rollback_with_num_keeping_headers();
  reuse_on_delete_test();
  fragmented_reuse_test();
  enter_reuse_via_separate_kvs_test();
  superblock_recovery_test();
  crash_and_recover_with_num_keeping_test();
  reclaim_rollback_point_test();
  return 0;
}

Assistant:

int main() {
    /* Test if basic stale block re-use is functional */
    verify_stale_block_reuse_test();

    /* Test resuse of stale blocks with block_reusing_threshold
       set at 0, 65, 100 */
    verify_staleblock_reuse_param_test();
    reuse_with_snapshot_test();

    /* Test reclaiming of stale blocks while varying
       num_keeping_headers */
    verify_minimum_num_keeping_headers_param_test();
    verify_high_num_keeping_headers_param_test();

    /* Test to verify in-memory and disk snapshots before
       block reuse */
    snapshot_before_block_reuse_test(false);
    snapshot_before_block_reuse_test(true);

    /* Test to verify snapshot after block reuse */
    snapshot_after_block_reuse_test();

    /* Test block reusage with keys having variable value sizes */
    variable_value_size_test();

    /* Test rollback with block reusage */
    rollback_with_num_keeping_headers();

    /* Test block resuage with deletes */
    reuse_on_delete_test();

    /* Test block reusage with manual compaction */
    fragmented_reuse_test();

    /* Test to verify reuse mode with one kvstore does not affect others */
    enter_reuse_via_separate_kvs_test();

#if !defined(WIN32) && !defined(_WIN32)
    /* Test recovery from superblock corruption */
    superblock_recovery_test();
#endif

    /* Test rollback, verify snapshot, manual compaction upon recovery
       after crash */
    crash_and_recover_with_num_keeping_test();

    reclaim_rollback_point_test();

    return 0;
}